

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall flatbuffers::cpp::CppGenerator::GenEmbeddedIncludes(CppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parser *pPVar2;
  string *psVar3;
  pointer pcVar4;
  long *plVar5;
  size_type *psVar6;
  CodeWriter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pPVar2 = (this->super_BaseGenerator).parser_;
  if (((pPVar2->opts).binary_schema_gen_embed == true) &&
     (pPVar2->root_struct_def_ != (StructDef *)0x0)) {
    psVar3 = (this->super_BaseGenerator).file_name_;
    paVar1 = &local_b8.field_2;
    pcVar4 = (psVar3->_M_dataplus)._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar4,pcVar4 + psVar3->_M_string_length);
    std::__cxx11::string::append((char *)&local_b8);
    BaseGenerator::GeneratedFileName
              (&local_38,&this->super_BaseGenerator,&(this->opts_).super_IDLOptions.include_prefix,
               &local_b8,&(this->opts_).super_IDLOptions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"// For access to the binary schema that produced this file.","")
    ;
    this_00 = &this->code_;
    CodeWriter::operator+=(this_00,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b8,"#include \"",&local_38);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98.field_2._8_8_ = plVar5[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_98._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    CodeWriter::operator+=(this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenEmbeddedIncludes() {
    if (parser_.opts.binary_schema_gen_embed && parser_.root_struct_def_) {
      const std::string file_path =
          GeneratedFileName(opts_.include_prefix, file_name_ + "_bfbs", opts_);
      code_ += "// For access to the binary schema that produced this file.";
      code_ += "#include \"" + file_path + "\"";
      code_ += "";
    }
  }